

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall
QGraphicsItemPrivate::combineTransformFromParent
          (QGraphicsItemPrivate *this,QTransform *x,QTransform *viewTransform)

{
  bool bVar1;
  long in_RDX;
  QTransform *in_RSI;
  QGraphicsItemPrivate *in_RDI;
  long in_FS_OFFSET;
  qreal qVar2;
  qreal qVar3;
  QGraphicsItemPrivate *this_00;
  undefined1 local_a8 [32];
  QTransform *in_stack_ffffffffffffff78;
  QGraphicsItem *in_stack_ffffffffffffff80;
  undefined1 local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  if ((in_RDX == 0) || (bVar1 = itemIsUntransformable(in_RDI), !bVar1)) {
    qVar2 = QPointF::x(&in_RDI->pos);
    qVar3 = QPointF::y(&in_RDI->pos);
    QTransform::translate(qVar2,qVar3);
    if (in_RDI->transformData != (TransformData *)0x0) {
      TransformData::computedFullTransform((TransformData *)this_00,in_RSI);
      memcpy(in_RSI,local_a8,0x4a);
    }
  }
  else {
    QGraphicsItem::deviceTransform(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    memcpy(in_RSI,local_58,0x4a);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsItemPrivate::combineTransformFromParent(QTransform *x, const QTransform *viewTransform) const
{
    // COMBINE
    if (viewTransform && itemIsUntransformable()) {
        *x = q_ptr->deviceTransform(*viewTransform);
    } else {
        x->translate(pos.x(), pos.y());
        if (transformData)
            *x = transformData->computedFullTransform(x);
    }
}